

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_error adios2_get_parameter(char *value,size_t *size,adios2_io *io,char *key)

{
  const_iterator cVar1;
  allocator local_89;
  key_type local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string
            ((string *)&local_48,"for const adios2_io, in call to adios2_get_parameter",
             (allocator *)&local_88);
  adios2::helper::CheckForNullptr<adios2_io_const>(io,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string
            ((string *)&local_68,"for size_t* size, in call to adios2_get_parameter",
             (allocator *)&local_88);
  adios2::helper::CheckForNullptr<unsigned_long>(size,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_88,key,&local_89);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(io + 0x60),&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (cVar1._M_node == (_Base_ptr)(io + 0x68)) {
    *size = 0;
  }
  else {
    anon_unknown.dwarf_11ae2::String2CAPI((string *)(cVar1._M_node + 2),value,size);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_get_parameter(char *value, size_t *size, const adios2_io *io, const char *key)
{
    try
    {
        adios2::helper::CheckForNullptr(io, "for const adios2_io, in call to adios2_get_parameter");

        const adios2::core::IO *ioCpp = reinterpret_cast<const adios2::core::IO *>(io);

        adios2::helper::CheckForNullptr(size, "for size_t* size, in call to adios2_get_parameter");

        auto itParameter = ioCpp->m_Parameters.find(key);
        if (itParameter == ioCpp->m_Parameters.end())
        {
            *size = 0;
            return adios2_error_none;
        }

        return String2CAPI(itParameter->second, value, size);
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get_parameter"));
    }
}